

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

string * PSBTRoleName_abi_cxx11_(PSBTRole role)

{
  allocator<char> *__a;
  uint in_ESI;
  string *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __a = (allocator<char> *)(ulong)in_ESI;
  switch(__a) {
  case (allocator<char> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,__a);
    std::allocator<char>::~allocator(&local_9);
    break;
  case (allocator<char> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,__a);
    std::allocator<char>::~allocator(&local_a);
    break;
  case (allocator<char> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,__a);
    std::allocator<char>::~allocator(&local_b);
    break;
  case (allocator<char> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,__a);
    std::allocator<char>::~allocator(&local_c);
    break;
  case (allocator<char> *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,__a);
    std::allocator<char>::~allocator(&local_d);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/psbt.cpp"
                  ,0x215,"std::string PSBTRoleName(PSBTRole)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string PSBTRoleName(PSBTRole role) {
    switch (role) {
    case PSBTRole::CREATOR: return "creator";
    case PSBTRole::UPDATER: return "updater";
    case PSBTRole::SIGNER: return "signer";
    case PSBTRole::FINALIZER: return "finalizer";
    case PSBTRole::EXTRACTOR: return "extractor";
        // no default case, so the compiler can warn about missing cases
    }
    assert(false);
}